

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::readFromBinary(Binasc *this,string *outfile,string *infile)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  ofstream output;
  ifstream input;
  long local_428;
  filebuf local_420 [240];
  ios_base local_330 [264];
  istream local_228 [520];
  
  std::ifstream::ifstream(local_228);
  std::ifstream::open((char *)local_228,(_Ios_Openmode)(infile->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot open ",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(infile->_M_dataplus)._M_p,infile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," for reading in binasc.",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    iVar2 = 0;
    std::ostream::flush();
  }
  else {
    std::ofstream::ofstream(&local_428);
    std::ofstream::open((char *)&local_428,(_Ios_Openmode)(outfile->_M_dataplus)._M_p);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot open ",0xc);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(outfile->_M_dataplus)._M_p,
                          outfile->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," for reading in binasc.",0x17);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      iVar2 = 0;
      std::ostream::flush();
    }
    else {
      iVar2 = readFromBinary(this,(ostream *)&local_428,local_228);
      std::ifstream::close();
      std::ofstream::close();
    }
    local_428 = _VTT;
    *(undefined8 *)(local_420 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_420);
    std::ios_base::~ios_base(local_330);
  }
  std::ifstream::~ifstream(local_228);
  return iVar2;
}

Assistant:

int Binasc::readFromBinary(const std::string& outfile, const std::string& infile) {
	std::ifstream input;
	input.open(infile.c_str());
	if (!input.is_open()) {
		std::cerr << "Cannot open " << infile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	std::ofstream output;
	output.open(outfile.c_str());
	if (!output.is_open()) {
		std::cerr << "Cannot open " << outfile
		          << " for reading in binasc." << std::endl;
		return 0;
	}

	int status = readFromBinary(output, input);
	input.close();
	output.close();
	return status;
}